

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::objectivec::TextFormatDecodeData::DecodeDataForString
                   (string *__return_storage_ptr__,string *input_for_decode,string *desired_output)

{
  char desired;
  long lVar1;
  ulong uVar2;
  ostream *poVar3;
  char cVar4;
  char input;
  string *__return_storage_ptr___00;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  undefined1 local_70 [24];
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((input_for_decode->_M_string_length == 0) || (desired_output->_M_string_length == 0)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "error: got empty string for making TextFormat data, input: \"");
    poVar3 = std::operator<<(poVar3,(string *)input_for_decode);
    poVar3 = std::operator<<(poVar3,"\", desired: \"");
    poVar3 = std::operator<<(poVar3,(string *)desired_output);
    poVar3 = std::operator<<(poVar3,"\".");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    local_58 = __return_storage_ptr__;
    lVar1 = std::__cxx11::string::find((char)input_for_decode,0);
    if (lVar1 == -1) {
      iVar6 = 0;
      lVar1 = std::__cxx11::string::find((char)desired_output,0);
      if (lVar1 == -1) {
        local_78._M_p = local_70 + 8;
        local_70._0_8_ = 0;
        local_70[8] = '\0';
        local_80[0] = (string)0x0;
        local_80[1] = true;
        local_80[2] = '\0';
        local_80._4_4_ = 0;
        uVar5 = 0;
        do {
          __return_storage_ptr___00 = local_58;
          uVar2 = (ulong)iVar6;
          if (desired_output->_M_string_length <= uVar5) {
            if (input_for_decode->_M_string_length == uVar2) {
              anon_unknown_0::DecodeDataBuilder::Push((DecodeDataBuilder *)local_80);
              __return_storage_ptr___00 = local_58;
              std::__cxx11::string::string((string *)&local_50,(string *)&local_78);
              std::operator+(__return_storage_ptr___00,&local_50,'\0');
              std::__cxx11::string::~string((string *)&local_50);
            }
            else {
              anon_unknown_0::DirectDecodeString(local_58,desired_output);
            }
LAB_00261278:
            std::__cxx11::string::~string((string *)&local_78);
            return __return_storage_ptr___00;
          }
          desired = (desired_output->_M_dataplus)._M_p[uVar5];
          if (desired == '_') {
            anon_unknown_0::DecodeDataBuilder::Push((DecodeDataBuilder *)local_80);
            local_80[0] = (string)0x1;
          }
          else {
            if (input_for_decode->_M_string_length <= uVar2) {
LAB_0026124d:
              __return_storage_ptr___00 = local_58;
              anon_unknown_0::DirectDecodeString(local_58,desired_output);
              goto LAB_00261278;
            }
            input = (input_for_decode->_M_dataplus)._M_p[uVar2];
            if (local_80._4_4_ == 0x1f) {
              anon_unknown_0::DecodeDataBuilder::Push((DecodeDataBuilder *)local_80);
            }
            if (local_80._4_4_ == 0) {
LAB_002611e0:
              bVar7 = anon_unknown_0::DecodeDataBuilder::AddFirst
                                ((DecodeDataBuilder *)local_80,desired,input);
              if (!bVar7) goto LAB_0026124d;
            }
            else {
              if (desired == input) {
                bVar7 = (byte)(desired + 0xbfU) < 0x1a;
                if ((!bVar7) && (local_80[2] == '`')) {
                  anon_unknown_0::DecodeDataBuilder::Push((DecodeDataBuilder *)local_80);
                  input = desired;
                  goto LAB_002611e0;
                }
              }
              else {
                cVar4 = input + -0x20;
                if (0x19 < (byte)(input + 0x9fU)) {
                  cVar4 = input;
                }
                if ((cVar4 != desired) || ((bool)local_80[1] != true)) {
                  anon_unknown_0::DecodeDataBuilder::Push((DecodeDataBuilder *)local_80);
                  goto LAB_002611e0;
                }
                local_80[2] = '`';
                bVar7 = (byte)(desired + 0xbfU) < 0x1a;
              }
              local_80._4_4_ = local_80._4_4_ + 1;
              local_80[1] = local_80[1] & bVar7;
            }
            iVar6 = iVar6 + 1;
          }
          uVar5 = uVar5 + 1;
        } while( true );
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "error: got a null char in a string for making TextFormat data,");
    poVar3 = std::operator<<(poVar3," input: \"");
    CEscape((string *)local_80,input_for_decode);
    poVar3 = std::operator<<(poVar3,(string *)local_80);
    poVar3 = std::operator<<(poVar3,"\", desired: \"");
    CEscape(&local_50,desired_output);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    poVar3 = std::operator<<(poVar3,"\".");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)local_80);
  }
  std::ostream::flush();
  abort();
}

Assistant:

string TextFormatDecodeData::DecodeDataForString(const string& input_for_decode,
                                                 const string& desired_output) {
  if ((input_for_decode.size() == 0) || (desired_output.size() == 0)) {
    cerr << "error: got empty string for making TextFormat data, input: \""
         << input_for_decode << "\", desired: \"" << desired_output << "\"."
         << endl;
    cerr.flush();
    abort();
  }
  if ((input_for_decode.find('\0') != string::npos) ||
      (desired_output.find('\0') != string::npos)) {
    cerr << "error: got a null char in a string for making TextFormat data,"
         << " input: \"" << CEscape(input_for_decode) << "\", desired: \""
         << CEscape(desired_output) << "\"." << endl;
    cerr.flush();
    abort();
  }

  DecodeDataBuilder builder;

  // Walk the output building it from the input.
  int x = 0;
  for (int y = 0; y < desired_output.size(); y++) {
    const char d = desired_output[y];
    if (d == '_') {
      builder.AddUnderscore();
      continue;
    }

    if (x >= input_for_decode.size()) {
      // Out of input, no way to encode it, just return a full decode.
      return DirectDecodeString(desired_output);
    }
    if (builder.AddCharacter(d, input_for_decode[x])) {
      ++x;  // Consumed one input
    } else {
      // Couldn't transform for the next character, just return a full decode.
      return DirectDecodeString(desired_output);
    }
  }

  if (x != input_for_decode.size()) {
    // Extra input (suffix from name sanitizing?), just return a full decode.
    return DirectDecodeString(desired_output);
  }

  // Add the end marker.
  return builder.Finish() + (char)'\0';
}